

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

iterator * __thiscall Catch::TextFlow::Columns::iterator::operator++(iterator *this)

{
  pointer pcVar1;
  pointer pCVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  pCVar2 = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_columns->
      super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>)._M_impl
      .super__Vector_impl_data._M_finish != pCVar2) {
    lVar5 = 0;
    lVar3 = 0;
    uVar4 = 0;
    do {
      pcVar1 = (this->m_iterators).
               super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((*(long *)((long)&pcVar1->m_lineStart + lVar3) !=
           *(long *)((long)&(pCVar2->m_string)._M_string_length + lVar5)) ||
         ((long)&(pCVar2->m_string)._M_dataplus._M_p + lVar5 !=
          *(long *)((long)&pcVar1->m_column + lVar3))) {
        Column::const_iterator::operator++((const_iterator *)((long)&pcVar1->m_column + lVar3));
      }
      uVar4 = uVar4 + 1;
      pCVar2 = (this->m_columns->
               super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x28;
      lVar5 = lVar5 + 0x38;
    } while (uVar4 < (ulong)(((long)(this->m_columns->
                                    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  return this;
}

Assistant:

Columns::iterator& Columns::iterator::operator++() {
            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                if ( m_iterators[i] != m_columns[i].end() ) {
                    ++m_iterators[i];
                }
            }
            return *this;
        }